

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Macintosh.cpp
# Opt level: O0

HalfCycles __thiscall
Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)0>::
perform_bus_operation<CPU::MC68000::Microcycle<321u>>
          (ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)0> *this,
          Microcycle<321U> *cycle,int param_2)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  pointer this_00;
  uint *__n;
  void *__buf;
  HalfCycles local_88;
  undefined1 local_7d;
  uint local_7c;
  undefined1 local_78 [2];
  uint8_t read;
  bool dma_acknowledge;
  int register_address_2;
  uint local_48;
  uint local_44;
  int register_address_1;
  int register_address;
  uint8_t *memory_base;
  WrappedInt<HalfCycles> WStack_30;
  uint32_t address;
  int local_24;
  WrappedInt<Cycles> WStack_20;
  int param_2_local;
  Microcycle<321U> *cycle_local;
  ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)0> *this_local;
  HalfCycles delay;
  
  WStack_30.length_ = (cycle->length).super_WrappedInt<HalfCycles>.length_;
  local_24 = param_2;
  WStack_20.length_ = (IntType)cycle;
  cycle_local = (Microcycle<321U> *)this;
  advance_time(this,(HalfCycles)WStack_30.length_);
  memory_base._4_4_ =
       CPU::MC68000::Microcycle<321U>::host_endian_byte_address
                 ((Microcycle<321U> *)WStack_20.length_);
  CPU::MC68000::
  Processor<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)0>,_true,_true,_false>
  ::set_is_peripheral_address(&this->mc68000_,0xdfffff < memory_base._4_4_);
  bVar1 = CPU::MC68000::Microcycle<321U>::data_select_active((Microcycle<321U> *)WStack_20.length_);
  if (bVar1) {
    register_address_1._0_1_ = false;
    register_address_1._1_1_ = false;
    stack0xffffffffffffffc2 = 0;
    HalfCycles::HalfCycles((HalfCycles *)&this_local);
    __n = &switchD_0057fddc::switchdataD_00a3e51c;
    switch(this->memory_map_[memory_base._4_4_ >> 0x11]) {
    case RAM:
      if (this->ram_mask_ - 0xd900 < memory_base._4_4_) {
        update_video(this);
      }
      _register_address_1 =
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->ram_);
      memory_base._4_4_ = this->ram_mask_ & memory_base._4_4_;
      bVar1 = video_is_outputting(this);
      if ((bVar1) && (this->ram_subcycle_ < 8)) {
        HalfCycles::HalfCycles(&local_88,(long)(8 - this->ram_subcycle_));
        this_local = (ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)0> *)
                     local_88.super_WrappedInt<HalfCycles>.length_;
        advance_time(this,local_88);
      }
      CPU::MC68000::Microcycle<321U>::apply
                ((Microcycle<321U> *)WStack_20.length_,_register_address_1 + memory_base._4_4_,0x18)
      ;
      break;
    case ROM:
      break;
    case VIA:
      if ((**(uint32_t **)(WStack_20.length_ + 8) & 1) == 0) {
        uVar3 = memory_base._4_4_ >> 9;
        local_44 = uVar3;
        bVar2 = CPU::MC68000::Microcycle<321U>::value8_high((Microcycle<321U> *)WStack_20.length_);
        MOS::MOS6522::
        MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)0>::VIAPortHandler>
        ::write(&this->via_,uVar3,(void *)(ulong)bVar2,(size_t)__n);
      }
      else {
        fill_unmapped<CPU::MC68000::Microcycle<321u>>(this,(Microcycle<321U> *)WStack_20.length_);
      }
      break;
    case IWM:
      if ((**(uint32_t **)(WStack_20.length_ + 8) & 1) == 0) {
        fill_unmapped<CPU::MC68000::Microcycle<321u>>(this,(Microcycle<321U> *)WStack_20.length_);
      }
      else {
        local_48 = memory_base._4_4_ >> 9;
        JustInTimeActor<Apple::IWM,_HalfCycles,_1,_1>::operator->
                  ((JustInTimeActor<Apple::IWM,_HalfCycles,_1,_1> *)local_78);
        this_00 = std::
                  unique_ptr<Apple::IWM,_JustInTimeActor<Apple::IWM,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                  ::operator->((unique_ptr<Apple::IWM,_JustInTimeActor<Apple::IWM,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                                *)local_78);
        uVar3 = local_48;
        bVar2 = CPU::MC68000::Microcycle<321U>::value8_low((Microcycle<321U> *)WStack_20.length_);
        IWM::write(this_00,uVar3,(void *)(ulong)bVar2,(size_t)__n);
        std::
        unique_ptr<Apple::IWM,_JustInTimeActor<Apple::IWM,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
        ::~unique_ptr((unique_ptr<Apple::IWM,_JustInTimeActor<Apple::IWM,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                       *)local_78);
      }
      break;
    case SCCWrite:
      if ((**(uint32_t **)(WStack_20.length_ + 8) & 1) == 0) {
        fill_unmapped<CPU::MC68000::Microcycle<321u>>(this,(Microcycle<321U> *)WStack_20.length_);
      }
      else {
        Zilog::SCC::z8530::write
                  (&this->scc_,memory_base._4_4_ >> 1,
                   (void *)(ulong)((*(SlicedInt16 **)(WStack_20.length_ + 0x10))->field_1).b,
                   0xa3e51c);
      }
      break;
    case SCCReadResetPhase:
      if ((**(uint32_t **)(WStack_20.length_ + 8) & 1) == 0) {
        Zilog::SCC::z8530::read(&this->scc_,memory_base._4_4_ >> 1,__buf,0xa3e51c);
      }
      else {
        Zilog::SCC::z8530::reset(&this->scc_);
      }
      break;
    case SCSI:
      uVar3 = memory_base._4_4_ >> 4;
      local_7d = (memory_base._4_4_ & 0x200) != 0;
      if ((**(uint32_t **)(WStack_20.length_ + 8) & 1) != 0) {
        local_7c = uVar3;
        bVar2 = CPU::MC68000::Microcycle<321U>::value8_high((Microcycle<321U> *)WStack_20.length_);
        NCR::NCR5380::NCR5380::write(&this->scsi_,uVar3,(void *)(ulong)bVar2,0);
      }
      break;
    case PhaseRead:
      break;
    case Unassigned:
      fill_unmapped<CPU::MC68000::Microcycle<321u>>(this,(Microcycle<321U> *)WStack_20.length_);
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Apple/Macintosh/Macintosh.cpp"
                    ,0xe4,
                    "HalfCycles Apple::Macintosh::ConcreteMachine<Analyser::Static::Macintosh::Target::Model::Mac128k>::perform_bus_operation(const Microcycle &, int) [model = Analyser::Static::Macintosh::Target::Model::Mac128k, Microcycle = CPU::MC68000::Microcycle<321>]"
                   );
    }
  }
  else {
    HalfCycles::HalfCycles((HalfCycles *)&this_local,0);
  }
  return (HalfCycles)(WrappedInt<HalfCycles>)this_local;
}

Assistant:

HalfCycles perform_bus_operation(const Microcycle &cycle, int) {
			// Advance time.
			advance_time(cycle.length);

			// A null cycle leaves nothing else to do.
			if(!(cycle.operation & (CPU::MC68000::Operation::NewAddress | CPU::MC68000::Operation::SameAddress))) return HalfCycles(0);

			// Grab the address.
			auto address = cycle.host_endian_byte_address();

			// Everything above E0 0000 is signalled as being on the peripheral bus.
			//
			// This will also act to autovector interrupts, since an interrupt acknowledge
			// cycle posts an address with all the higher-order bits set, and VPA doubles
			// as the input to request an autovector.
			mc68000_.set_is_peripheral_address(address >= 0xe0'0000);

			// All code below deals only with reads and writes — cycles in which a
			// data select is active. So quit now if this is not the active part of
			// a read or write.
			//
			// The 68000 uses 6800-style autovectored interrupts, so the mere act of
			// having set VPA above deals with those given that the generated address
			// for interrupt acknowledge cycles always has all bits set except the
			// lowest explicit address lines.
			if(
				!cycle.data_select_active() ||
				(cycle.operation & CPU::MC68000::Operation::InterruptAcknowledge)
			) return HalfCycles(0);

			// Grab the word-precision address being accessed.
			uint8_t *memory_base = nullptr;
			HalfCycles delay;
			switch(memory_map_[address >> 17]) {
				default: assert(false);

				case BusDevice::Unassigned:
					fill_unmapped(cycle);
				return delay;

				case BusDevice::VIA: {
					if(*cycle.address & 1) {
						fill_unmapped(cycle);
					} else {
						const int register_address = address >> 9;

						// VIA accesses are via address 0xefe1fe + register*512,
						// which at word precision is 0x77f0ff + register*256.
						if(cycle.operation & CPU::MC68000::Operation::Read) {
							cycle.set_value8_high(via_.read(register_address));
						} else {
							via_.write(register_address, cycle.value8_high());
						}
					}
				} return delay;

				case BusDevice::PhaseRead: {
					if(cycle.operation & CPU::MC68000::Operation::Read) {
						cycle.set_value8_low(phase_ & 7);
					}
				} return delay;

				case BusDevice::IWM: {
					if(*cycle.address & 1) {
						const int register_address = address >> 9;

						// The IWM; this is a purely polled device, so can be run on demand.
						if(cycle.operation & CPU::MC68000::Operation::Read) {
							cycle.set_value8_low(iwm_->read(register_address));
						} else {
							iwm_->write(register_address, cycle.value8_low());
						}
					} else {
						fill_unmapped(cycle);
					}
				} return delay;

				case BusDevice::SCSI: {
					const int register_address = address >> 4;
					const bool dma_acknowledge = address & 0x200;

					// Even accesses = read; odd = write.
					if(*cycle.address & 1) {
						// Odd access => this is a write. Data will be in the upper byte.
						if(cycle.operation & CPU::MC68000::Operation::Read) {
							scsi_.write(register_address, 0xff, dma_acknowledge);
						} else {
							scsi_.write(register_address, cycle.value8_high());
						}
					} else {
						// Even access => this is a read.
						if(cycle.operation & CPU::MC68000::Operation::Read) {
							cycle.set_value8_high(scsi_.read(register_address, dma_acknowledge));
						}
					}
				} return delay;

				case BusDevice::SCCReadResetPhase: {
					// Any word access here adjusts phase.
					if(cycle.operation & CPU::MC68000::Operation::SelectWord) {
						adjust_phase();
					} else {
						// A0 = 1 => reset; A0 = 0 => read.
						if(*cycle.address & 1) {
							scc_.reset();

							if(cycle.operation & CPU::MC68000::Operation::Read) {
								cycle.set_value16(0xffff);
							}
						} else {
							const auto read = scc_.read(int(address >> 1));
							if(cycle.operation & CPU::MC68000::Operation::Read) {
								cycle.set_value8_high(read);
							}
						}
					}
				} return delay;

				case BusDevice::SCCWrite: {
					// Any word access here adjusts phase.
					if(cycle.operation & CPU::MC68000::Operation::SelectWord) {
						adjust_phase();
					} else {
						// This is definitely a byte access; either it's to an odd address, in which
						// case it will reach the SCC, or it isn't, in which case it won't.
						if(*cycle.address & 1) {
							if(cycle.operation & CPU::MC68000::Operation::Read) {
								scc_.write(int(address >> 1), 0xff);
								cycle.value->b = 0xff;
							} else {
								scc_.write(int(address >> 1), cycle.value->b);
							}
						} else {
							fill_unmapped(cycle);
						}
					}
				} return delay;

				case BusDevice::RAM: {
					// This is coupled with the Macintosh implementation of video; the magic
					// constant should probably be factored into the Video class.
					// It embodies knowledge of the fact that video (and audio) will always
					// be fetched from the final $d900 bytes of memory.
					// (And that ram_mask_ = ram size - 1).
					if(address > ram_mask_ - 0xd900)
						update_video();

					memory_base = ram_.data();
					address &= ram_mask_;

					// Apply a delay due to video contention if applicable; scheme applied:
					// only every other access slot is available during the period of video
					// output. I believe this to be correct for the 128k, 512k and Plus.
					// More research to do on other models.
					if(video_is_outputting() && ram_subcycle_ < 8) {
						delay = HalfCycles(8 - ram_subcycle_);
						advance_time(delay);
					}
				} break;

				case BusDevice::ROM: {
					if(!(cycle.operation & CPU::MC68000::Operation::Read)) return delay;
					memory_base = rom_;
					address &= rom_mask_;
				} break;
			}

			// If control has fallen through to here, the access is either a read from ROM, or a read or write to RAM.
			// Potential writes to ROM and all hardware accesses have already been weeded out.
			cycle.apply(&memory_base[address]);

			return delay;
		}